

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_result_modifier.cpp
# Opt level: O0

bool duckdb::BoundOrderModifier::Equals(BoundOrderModifier *left,BoundOrderModifier *right)

{
  bool bVar1;
  BoundOrderByNode *this;
  BoundOrderByNode *pBVar2;
  BoundOrderByNode *pBVar3;
  long in_RSI;
  long in_RDI;
  idx_t i;
  const_reference in_stack_ffffffffffffffc8;
  BoundOrderByNode *local_20;
  bool local_1;
  
  this = (BoundOrderByNode *)
         ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::size
                   ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
                    (in_RDI + 0x10));
  pBVar2 = (BoundOrderByNode *)
           ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::size
                     ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *
                      )(in_RSI + 0x10));
  if (this == pBVar2) {
    local_20 = (BoundOrderByNode *)0x0;
    while (pBVar2 = local_20,
          pBVar3 = (BoundOrderByNode *)
                   ::std::
                   vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::size
                             ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                               *)(in_RDI + 0x10)), pBVar2 < pBVar3) {
      in_stack_ffffffffffffffc8 =
           vector<duckdb::BoundOrderByNode,_true>::operator[]
                     ((vector<duckdb::BoundOrderByNode,_true> *)pBVar2,
                      (size_type)in_stack_ffffffffffffffc8);
      vector<duckdb::BoundOrderByNode,_true>::operator[]
                ((vector<duckdb::BoundOrderByNode,_true> *)pBVar2,
                 (size_type)in_stack_ffffffffffffffc8);
      bVar1 = BoundOrderByNode::Equals(this,pBVar2);
      if (!bVar1) {
        return false;
      }
      local_20 = (BoundOrderByNode *)&local_20->null_order;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool BoundOrderModifier::Equals(const BoundOrderModifier &left, const BoundOrderModifier &right) {
	if (left.orders.size() != right.orders.size()) {
		return false;
	}
	for (idx_t i = 0; i < left.orders.size(); i++) {
		if (!left.orders[i].Equals(right.orders[i])) {
			return false;
		}
	}
	return true;
}